

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O2

uint32_t InstructionSet::x86::
         address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)2,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                   (Instruction<false> *instruction,DataPointer pointer,Context *context)

{
  type_conflict2 tVar1;
  ImmediateT IVar2;
  ulong in_RAX;
  uint16_t zero;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffff;
  tVar1 = resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                    (instruction,(&DAT_0046a040)[(ushort)pointer >> 0xb & 7],pointer,context,
                     (unsigned_short *)((long)&uStack_18 + 6),(unsigned_short *)0x0);
  IVar2 = Instruction<false>::offset(instruction);
  return (uint)IVar2 + (uint)tVar1;
}

Assistant:

uint32_t address(
	InstructionT &instruction,
	DataPointer pointer,
	ContextT &context
) {
	if constexpr (source == Source::DirectAddress) {
		return instruction.offset();
	}

	uint32_t address;
	uint16_t zero = 0;
	address = resolve<uint16_t, AccessType::Read>(instruction, pointer.index(), pointer, context, &zero);
	if constexpr (is_32bit(ContextT::model)) {
		address <<= pointer.scale();
	}
	address += instruction.offset();

	if constexpr (source == Source::IndirectNoBase) {
		return address;
	}
	return address + resolve<uint16_t, AccessType::Read>(instruction, pointer.base(), pointer, context);
}